

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_1::WatWriter::WriteModule(WatWriter *this)

{
  bool bVar1;
  ModuleFieldType MVar2;
  ulong uVar3;
  ModuleFieldList *this_00;
  reference this_01;
  FuncModuleField *pFVar4;
  GlobalModuleField *pGVar5;
  ImportModuleField *pIVar6;
  type import;
  EventModuleField *pEVar7;
  ExportModuleField *pEVar8;
  TableModuleField *pTVar9;
  ElemSegmentModuleField *pEVar10;
  MemoryModuleField *pMVar11;
  DataSegmentModuleField *pDVar12;
  TypeModuleField *pTVar13;
  type type;
  StartModuleField *pSVar14;
  const_iterator rhs;
  ModuleField *field;
  const_iterator __end2;
  const_iterator __begin2;
  ModuleFieldList *__range2;
  WatWriter *local_18;
  WatWriter *this_local;
  
  local_18 = this;
  BuildInlineExportMap(this);
  BuildInlineImportMap(this);
  WriteOpenSpace(this,"module");
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    string_view::string_view((string_view *)&__range2,&((this->super_ModuleContext).module)->name);
    WriteName(this,___range2,Newline);
  }
  else {
    WriteNewline(this,false);
  }
  this_00 = &((this->super_ModuleContext).module)->fields;
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(this_00);
  rhs = intrusive_list<wabt::ModuleField>::end(this_00);
  while (bVar1 = intrusive_list<wabt::ModuleField>::const_iterator::operator!=
                           ((const_iterator *)&__end2.node_,rhs), bVar1) {
    this_01 = intrusive_list<wabt::ModuleField>::const_iterator::operator*
                        ((const_iterator *)&__end2.node_);
    MVar2 = ModuleField::type(this_01);
    switch(MVar2) {
    case Func:
      pFVar4 = cast<wabt::FuncModuleField,wabt::ModuleField>(this_01);
      WriteFunc(this,&pFVar4->func);
      break;
    case Global:
      pGVar5 = cast<wabt::GlobalModuleField,wabt::ModuleField>(this_01);
      WriteGlobal(this,&pGVar5->global);
      break;
    case Import:
      pIVar6 = cast<wabt::ImportModuleField,wabt::ModuleField>(this_01);
      import = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::operator*
                         (&pIVar6->import);
      WriteImport(this,import);
      break;
    case Export:
      pEVar8 = cast<wabt::ExportModuleField,wabt::ModuleField>(this_01);
      WriteExport(this,&pEVar8->export_);
      break;
    case Type:
      pTVar13 = cast<wabt::TypeModuleField,wabt::ModuleField>(this_01);
      type = std::unique_ptr<wabt::TypeEntry,_std::default_delete<wabt::TypeEntry>_>::operator*
                       (&pTVar13->type);
      WriteTypeEntry(this,type);
      break;
    case Table:
      pTVar9 = cast<wabt::TableModuleField,wabt::ModuleField>(this_01);
      WriteTable(this,&pTVar9->table);
      break;
    case ElemSegment:
      pEVar10 = cast<wabt::ElemSegmentModuleField,wabt::ModuleField>(this_01);
      WriteElemSegment(this,&pEVar10->elem_segment);
      break;
    case Memory:
      pMVar11 = cast<wabt::MemoryModuleField,wabt::ModuleField>(this_01);
      WriteMemory(this,&pMVar11->memory);
      break;
    case DataSegment:
      pDVar12 = cast<wabt::DataSegmentModuleField,wabt::ModuleField>(this_01);
      WriteDataSegment(this,&pDVar12->data_segment);
      break;
    case Start:
      pSVar14 = cast<wabt::StartModuleField,wabt::ModuleField>(this_01);
      WriteStartFunction(this,&pSVar14->start);
      break;
    case Event:
      pEVar7 = cast<wabt::EventModuleField,wabt::ModuleField>(this_01);
      WriteEvent(this,&pEVar7->event);
    }
    intrusive_list<wabt::ModuleField>::const_iterator::operator++((const_iterator *)&__end2.node_);
  }
  WriteCloseNewline(this);
  WriteNextChar(this);
  return (Result)(this->result_).enum_;
}

Assistant:

Result WatWriter::WriteModule() {
  BuildInlineExportMap();
  BuildInlineImportMap();
  WriteOpenSpace("module");
  if (module.name.empty()) {
    WriteNewline(NO_FORCE_NEWLINE);
  } else {
    WriteName(module.name, NextChar::Newline);
  }
  for (const ModuleField& field : module.fields) {
    switch (field.type()) {
      case ModuleFieldType::Func:
        WriteFunc(cast<FuncModuleField>(&field)->func);
        break;
      case ModuleFieldType::Global:
        WriteGlobal(cast<GlobalModuleField>(&field)->global);
        break;
      case ModuleFieldType::Import:
        WriteImport(*cast<ImportModuleField>(&field)->import);
        break;
      case ModuleFieldType::Event:
        WriteEvent(cast<EventModuleField>(&field)->event);
        break;
      case ModuleFieldType::Export:
        WriteExport(cast<ExportModuleField>(&field)->export_);
        break;
      case ModuleFieldType::Table:
        WriteTable(cast<TableModuleField>(&field)->table);
        break;
      case ModuleFieldType::ElemSegment:
        WriteElemSegment(cast<ElemSegmentModuleField>(&field)->elem_segment);
        break;
      case ModuleFieldType::Memory:
        WriteMemory(cast<MemoryModuleField>(&field)->memory);
        break;
      case ModuleFieldType::DataSegment:
        WriteDataSegment(cast<DataSegmentModuleField>(&field)->data_segment);
        break;
      case ModuleFieldType::Type:
        WriteTypeEntry(*cast<TypeModuleField>(&field)->type);
        break;
      case ModuleFieldType::Start:
        WriteStartFunction(cast<StartModuleField>(&field)->start);
        break;
    }
  }
  WriteCloseNewline();
  /* force the newline to be written */
  WriteNextChar();
  return result_;
}